

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::generateObjectStreams(QPDFWriter *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  ulong uVar5;
  Object *pOVar6;
  Object *obj;
  QPDFObjGen *local_80;
  QPDFObjGen *item;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *__range1;
  int local_50;
  uint local_4c;
  int cur_ostream;
  uint n;
  size_t n_per;
  ulong local_30;
  size_t n_object_streams;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> eligible;
  QPDFWriter *this_local;
  
  eligible.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  QPDF::Writer::getCompressibleObjGens
            ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams,peVar3->pdf);
  sVar4 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::size
                    ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams);
  local_30 = (sVar4 + 99) / 100;
  initializeTables(this,local_30 * 2);
  if (local_30 == 0) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (peVar3->obj).streams_empty = true;
    n_per._0_4_ = 1;
  }
  else {
    sVar4 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::size
                      ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams);
    _cur_ostream = sVar4 / local_30;
    uVar5 = _cur_ostream * local_30;
    sVar4 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::size
                      ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams);
    if (uVar5 < sVar4) {
      _cur_ostream = _cur_ostream + 1;
    }
    local_4c = 0;
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    QPDF::newIndirectNull((QPDF *)&__range1);
    iVar2 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)&__range1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
    local_50 = iVar2;
    __end1 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::begin
                       ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams);
    item = (QPDFObjGen *)
           std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::end
                     ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                                  *)&item);
      if (!bVar1) break;
      local_80 = __gnu_cxx::
                 __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                 ::operator*(&__end1);
      if (local_4c == _cur_ostream) {
        QTC::TC("qpdf","QPDFWriter generate >1 ostream",0);
        local_4c = 0;
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        QPDF::newIndirectNull((QPDF *)&obj);
        local_50 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)&obj);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&obj);
      }
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pOVar6 = ObjTable<QPDFWriter::Object>::operator[]
                         (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,*local_80);
      pOVar6->object_stream = local_50;
      iVar2 = QPDFObjGen::getGen(local_80);
      pOVar6->gen = iVar2;
      local_4c = local_4c + 1;
      __gnu_cxx::
      __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
      operator++(&__end1);
    }
    n_per._0_4_ = 0;
  }
  std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::~vector
            ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&n_object_streams);
  return;
}

Assistant:

void
QPDFWriter::generateObjectStreams()
{
    // Basic strategy: make a list of objects that can go into an object stream.  Then figure out
    // how many object streams are needed so that we can distribute objects approximately evenly
    // without having any object stream exceed 100 members.  We don't have to worry about linearized
    // files here -- if the file is linearized, we take care of excluding things that aren't allowed
    // here later.

    // This code doesn't do anything with /Extends.

    std::vector<QPDFObjGen> eligible = QPDF::Writer::getCompressibleObjGens(m->pdf);
    size_t n_object_streams = (eligible.size() + 99U) / 100U;

    initializeTables(2U * n_object_streams);
    if (n_object_streams == 0) {
        m->obj.streams_empty = true;
        return;
    }
    size_t n_per = eligible.size() / n_object_streams;
    if (n_per * n_object_streams < eligible.size()) {
        ++n_per;
    }
    unsigned int n = 0;
    int cur_ostream = m->pdf.newIndirectNull().getObjectID();
    for (auto const& item: eligible) {
        if (n == n_per) {
            QTC::TC("qpdf", "QPDFWriter generate >1 ostream");
            n = 0;
            // Construct a new null object as the "original" object stream.  The rest of the code
            // knows that this means we're creating the object stream from scratch.
            cur_ostream = m->pdf.newIndirectNull().getObjectID();
        }
        auto& obj = m->obj[item];
        obj.object_stream = cur_ostream;
        obj.gen = item.getGen();
        ++n;
    }
}